

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STPathSet.cpp
# Opt level: O3

Value __thiscall jbcoin::STPathSet::getJson(STPathSet *this,int options)

{
  vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *pvVar1;
  _func_int **pp_Var2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  undefined4 in_register_00000034;
  vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> *__x;
  Value VVar4;
  STPath it;
  vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> local_50;
  
  *(ushort *)&(this->super_STBase).fName =
       (ushort)*(undefined4 *)&(this->super_STBase).fName & 0xfe00 | 6;
  pp_Var2 = (_func_int **)operator_new(0x30);
  pp_Var2[2] = (_func_int *)0x0;
  pp_Var2[3] = (_func_int *)0x0;
  *pp_Var2 = (_func_int *)0x0;
  pp_Var2[1] = (_func_int *)0x0;
  pp_Var2[3] = (_func_int *)(pp_Var2 + 1);
  pp_Var2[4] = (_func_int *)(pp_Var2 + 1);
  pp_Var2[5] = (_func_int *)0x0;
  (this->super_STBase)._vptr_STBase = pp_Var2;
  __x = *(vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> **)
         (CONCAT44(in_register_00000034,options) + 0x10);
  pvVar1 = *(vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_> **)
            (CONCAT44(in_register_00000034,options) + 0x18);
  uVar3 = extraout_RDX;
  if (__x != pvVar1) {
    do {
      std::vector<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>::vector
                (&local_50,__x);
      STPath::getJson((STPath *)&stack0xffffffffffffffc8,(int)&local_50);
      Json::Value::append((Value *)this,(Value *)&stack0xffffffffffffffc8);
      Json::Value::~Value((Value *)&stack0xffffffffffffffc8);
      uVar3 = extraout_RDX_00;
      if (local_50.super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.
                        super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_50.
                              super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.
                              super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        uVar3 = extraout_RDX_01;
      }
      __x = __x + 1;
    } while (__x != pvVar1);
  }
  VVar4._8_8_ = uVar3;
  VVar4.value_.map_ = (ObjectValues *)this;
  return VVar4;
}

Assistant:

Json::Value
STPathSet::getJson (int options) const
{
    Json::Value ret (Json::arrayValue);
    for (auto it: value)
        ret.append (it.getJson (options));

    return ret;
}